

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void compile_recurse(compiler_common *common)

{
  jump_list *pjVar1;
  long lVar2;
  backtrack_common *list;
  PCRE2_SPTR16 compiler_00;
  int iVar3;
  int iVar4;
  sljit_s32 sVar5;
  sljit_label *psVar6;
  sljit_jump *psVar7;
  sljit_uw *psVar8;
  sljit_label *label;
  int iVar9;
  sljit_label *quit;
  sljit_jump *accept_exit;
  sljit_jump *alt2;
  sljit_jump *alt1;
  sljit_uw *next_update_addr;
  jump_list *match;
  backtrack_common altbacktrack;
  int local_size;
  int alt_max;
  int alt_count;
  int private_data_size;
  BOOL has_accept;
  BOOL has_quit;
  BOOL needs_control_head;
  PCRE2_SPTR16 ccend;
  PCRE2_SPTR16 ccbegin;
  PCRE2_SPTR16 cc;
  sljit_compiler *compiler;
  compiler_common *common_local;
  
  cc = (PCRE2_SPTR16)common->compiler;
  ccbegin = common->start + common->currententry->start;
  ccend = ccbegin + (long)(int)(uint)(*ccbegin != 0x83) + 2;
  compiler = (sljit_compiler *)common;
  _has_quit = bracketend(ccbegin);
  _has_quit = _has_quit + -2;
  iVar3 = get_recurse_data_length
                    ((compiler_common *)compiler,ccend,_has_quit,&has_accept,&private_data_size,
                     &alt_count);
  next_update_addr = (sljit_uw *)0x0;
  alt1 = (sljit_jump *)0x0;
  alt2 = (sljit_jump *)0x0;
  accept_exit = (sljit_jump *)0x0;
  quit = (sljit_label *)0x0;
  compiler->allocator_data = (void *)0x0;
  iVar4 = no_alternatives(ccbegin);
  local_size = 0;
  psVar6 = sljit_emit_label((sljit_compiler *)cc);
  (compiler[2].last_label)->addr = (sljit_uw)psVar6;
  set_jumps((jump_list *)compiler[2].last_label[1].next,
            (sljit_label *)(compiler[2].last_label)->addr);
  sljit_emit_fast_enter((sljit_compiler *)cc,4,0);
  count_match((compiler_common *)compiler);
  altbacktrack.cc._4_4_ = 1;
  if (1 < iVar4) {
    altbacktrack.cc._4_4_ = 2;
  }
  allocate_stack((compiler_common *)compiler,iVar3 + altbacktrack.cc._4_4_);
  sljit_emit_op1((sljit_compiler *)cc,0x20,0x8c,(long)((altbacktrack.cc._4_4_ + -1) * 8),4,0);
  copy_recurse_data((compiler_common *)compiler,ccend,_has_quit,0,altbacktrack.cc._4_4_,
                    iVar3 + altbacktrack.cc._4_4_,private_data_size);
  sljit_emit_op1((sljit_compiler *)cc,0x20,0x8e,(long)compiler->scratches,0xc,0);
  if (has_accept != 0) {
    sljit_emit_op1((sljit_compiler *)cc,0x20,0x8e,(long)*(int *)&compiler->field_0x64,0x40,0);
  }
  if (1 < iVar4) {
    sljit_emit_op1((sljit_compiler *)cc,0x20,0x8c,0,2,0);
  }
  memset(&match,0,0x28);
  compiler[1].executable_offset = 0;
  *(undefined8 *)&compiler[1].mode32 = 0;
  compiler[2].last_const = (sljit_const *)0x0;
  compiler[2].scratches = 0;
  compiler[2].saveds = 0;
  altbacktrack.topbacktracks = (jump_list *)ccend;
  ccbegin = ccbegin + (int)(uint)ccbegin[1];
  while( true ) {
    altbacktrack.nextbacktracks = (jump_list *)0x0;
    altbacktrack.top = (backtrack_common *)0x0;
    if (altbacktrack.topbacktracks != (jump_list *)ccend) {
      sljit_emit_op1((sljit_compiler *)cc,0x20,2,0,0x8c,0);
    }
    compile_matchingpath
              ((compiler_common *)compiler,(PCRE2_SPTR16)altbacktrack.topbacktracks,ccbegin,
               (backtrack_common *)&match);
    sVar5 = sljit_get_compiler_error((sljit_compiler *)cc);
    if (sVar5 != 0) {
      return;
    }
    iVar9 = 1;
    if (1 < iVar4 || alt_count != 0) {
      iVar9 = 2;
    }
    allocate_stack((compiler_common *)compiler,iVar9);
    sljit_emit_op1((sljit_compiler *)cc,0x20,4,0,0x8e,(long)compiler->scratches);
    if ((1 < iVar4) || (alt_count != 0)) {
      sljit_emit_op1((sljit_compiler *)cc,0x20,0x8c,8,0x40,(long)local_size);
    }
    compiler_00 = cc;
    psVar7 = sljit_emit_jump((sljit_compiler *)cc,0x18);
    add_jump((sljit_compiler *)compiler_00,(jump_list **)&next_update_addr,psVar7);
    if (local_size == 0) {
      psVar6 = sljit_emit_label((sljit_compiler *)cc);
      (compiler[2].last_label)->size = (sljit_uw)psVar6;
      set_jumps((jump_list *)compiler[2].last_label[1].addr,
                (sljit_label *)(compiler[2].last_label)->size);
      sljit_emit_fast_enter((sljit_compiler *)cc,1,0);
      if (alt_count != 0) {
        quit = (sljit_label *)sljit_emit_cmp((sljit_compiler *)cc,0,0x8c,8,0x40,(long)iVar4 << 3);
      }
      sljit_emit_op1((sljit_compiler *)cc,0x20,4,0,0x8c,0);
      sljit_emit_op1((sljit_compiler *)cc,0x20,0x84,(long)((altbacktrack.cc._4_4_ + -1) * 8),1,0);
      copy_recurse_data((compiler_common *)compiler,ccend,_has_quit,4,altbacktrack.cc._4_4_,
                        iVar3 + altbacktrack.cc._4_4_,private_data_size);
      if (iVar4 < 2) {
        iVar9 = 1;
        if (alt_count != 0) {
          iVar9 = 2;
        }
        free_stack((compiler_common *)compiler,iVar9);
      }
      else {
        sljit_emit_op1((sljit_compiler *)cc,0x20,1,0,0x8c,8);
        free_stack((compiler_common *)compiler,2);
        if (iVar4 < 5) {
          if (iVar4 == 4) {
            accept_exit = sljit_emit_cmp((sljit_compiler *)cc,3,1,0,0x40,0x10);
          }
          alt2 = sljit_emit_cmp((sljit_compiler *)cc,3,1,0,0x40,8);
        }
        else {
          psVar8 = allocate_read_only_data((compiler_common *)compiler,(long)iVar4 << 3);
          if (psVar8 == (sljit_uw *)0x0) {
            return;
          }
          sljit_emit_ijump((sljit_compiler *)cc,0x18,0x81,(sljit_sw)psVar8);
          alt1 = (sljit_jump *)(psVar8 + 1);
          add_label_addr((compiler_common *)compiler,psVar8);
        }
      }
    }
    else if (iVar4 < 5) {
      if (local_size == 0x10) {
        psVar6 = sljit_emit_label((sljit_compiler *)cc);
        sljit_set_label(accept_exit,psVar6);
        if (iVar4 == 4) {
          alt2 = sljit_emit_cmp((sljit_compiler *)cc,3,1,0,0x40,0x18);
        }
      }
      else {
        psVar6 = sljit_emit_label((sljit_compiler *)cc);
        sljit_set_label(alt2,psVar6);
        if ((iVar4 == 3) && (local_size == 8)) {
          accept_exit = sljit_emit_cmp((sljit_compiler *)cc,3,1,0,0x40,0x10);
        }
      }
    }
    else {
      add_label_addr((compiler_common *)compiler,(sljit_uw *)alt1);
      alt1 = (sljit_jump *)&alt1->addr;
    }
    local_size = local_size + 8;
    compile_backtrackingpath
              ((compiler_common *)compiler,(backtrack_common *)altbacktrack.nextbacktracks);
    sVar5 = sljit_get_compiler_error((sljit_compiler *)cc);
    list = altbacktrack.top;
    if (sVar5 != 0) break;
    psVar6 = sljit_emit_label((sljit_compiler *)cc);
    set_jumps((jump_list *)list,psVar6);
    if (*ccbegin != 0x78) {
      psVar6 = sljit_emit_label((sljit_compiler *)cc);
      copy_recurse_data((compiler_common *)compiler,ccend,_has_quit,1,altbacktrack.cc._4_4_,
                        iVar3 + altbacktrack.cc._4_4_,private_data_size);
      sljit_emit_op1((sljit_compiler *)cc,0x20,4,0,0x8c,(long)((altbacktrack.cc._4_4_ + -1) * 8));
      free_stack((compiler_common *)compiler,iVar3 + altbacktrack.cc._4_4_);
      sljit_emit_op1((sljit_compiler *)cc,0x20,1,0,0x40,0);
      sljit_emit_fast_return((sljit_compiler *)cc,4,0);
      if (compiler[2].last_const != (sljit_const *)0x0) {
        pjVar1 = (jump_list *)compiler[2].last_const;
        label = sljit_emit_label((sljit_compiler *)cc);
        set_jumps(pjVar1,label);
        sljit_emit_op1((sljit_compiler *)cc,0x20,0xc,0,0x8e,(long)compiler->scratches);
        copy_recurse_data((compiler_common *)compiler,ccend,_has_quit,2,altbacktrack.cc._4_4_,
                          iVar3 + altbacktrack.cc._4_4_,private_data_size);
        psVar7 = sljit_emit_jump((sljit_compiler *)cc,0x18);
        sljit_set_label(psVar7,psVar6);
      }
      if (alt_count != 0) {
        psVar6 = sljit_emit_label((sljit_compiler *)cc);
        sljit_set_label((sljit_jump *)quit,psVar6);
        free_stack((compiler_common *)compiler,2);
        sljit_emit_op1((sljit_compiler *)cc,0x20,0x8c,(long)((altbacktrack.cc._4_4_ + -1) * 8),1,0);
        copy_recurse_data((compiler_common *)compiler,ccend,_has_quit,3,altbacktrack.cc._4_4_,
                          iVar3 + altbacktrack.cc._4_4_,private_data_size);
        sljit_emit_op1((sljit_compiler *)cc,0x20,4,0,0x8c,(long)((altbacktrack.cc._4_4_ + -1) * 8));
        free_stack((compiler_common *)compiler,iVar3 + altbacktrack.cc._4_4_);
        sljit_emit_op1((sljit_compiler *)cc,0x20,1,0,0x40,0);
        sljit_emit_fast_return((sljit_compiler *)cc,4,0);
      }
      lVar2._0_4_ = compiler[2].scratches;
      lVar2._4_4_ = compiler[2].saveds;
      if (lVar2 != 0) {
        pjVar1 = *(jump_list **)&compiler[2].scratches;
        psVar6 = sljit_emit_label((sljit_compiler *)cc);
        set_jumps(pjVar1,psVar6);
        sljit_emit_op1((sljit_compiler *)cc,0x20,0xc,0,0x8e,(long)compiler->scratches);
        sljit_emit_op1((sljit_compiler *)cc,0x20,4,0,0xc,0);
        allocate_stack((compiler_common *)compiler,2);
        sljit_emit_op1((sljit_compiler *)cc,0x20,0x8c,8,0x40,(long)local_size);
      }
      psVar8 = next_update_addr;
      psVar6 = sljit_emit_label((sljit_compiler *)cc);
      set_jumps((jump_list *)psVar8,psVar6);
      sljit_emit_op1((sljit_compiler *)cc,0x20,0x8c,0,4,0);
      copy_recurse_data((compiler_common *)compiler,ccend,_has_quit,4,altbacktrack.cc._4_4_,
                        iVar3 + altbacktrack.cc._4_4_,private_data_size);
      sljit_emit_op1((sljit_compiler *)cc,0x20,4,0,0x84,(long)((altbacktrack.cc._4_4_ + -1) * 8));
      sljit_emit_op1((sljit_compiler *)cc,0x20,1,0,0x40,1);
      sljit_emit_fast_return((sljit_compiler *)cc,4,0);
      return;
    }
    altbacktrack.topbacktracks = (jump_list *)(ccbegin + 2);
    ccbegin = ccbegin + (int)(uint)ccbegin[1];
  }
  return;
}

Assistant:

static SLJIT_INLINE void compile_recurse(compiler_common *common)
{
DEFINE_COMPILER;
PCRE2_SPTR cc = common->start + common->currententry->start;
PCRE2_SPTR ccbegin = cc + 1 + LINK_SIZE + (*cc == OP_BRA ? 0 : IMM2_SIZE);
PCRE2_SPTR ccend = bracketend(cc) - (1 + LINK_SIZE);
BOOL needs_control_head;
BOOL has_quit;
BOOL has_accept;
int private_data_size = get_recurse_data_length(common, ccbegin, ccend, &needs_control_head, &has_quit, &has_accept);
int alt_count, alt_max, local_size;
backtrack_common altbacktrack;
jump_list *match = NULL;
sljit_uw *next_update_addr = NULL;
struct sljit_jump *alt1 = NULL;
struct sljit_jump *alt2 = NULL;
struct sljit_jump *accept_exit = NULL;
struct sljit_label *quit;

/* Recurse captures then. */
common->then_trap = NULL;

SLJIT_ASSERT(*cc == OP_BRA || *cc == OP_CBRA || *cc == OP_CBRAPOS || *cc == OP_SCBRA || *cc == OP_SCBRAPOS);

alt_max = no_alternatives(cc);
alt_count = 0;

/* Matching path. */
SLJIT_ASSERT(common->currententry->entry_label == NULL && common->recursive_head_ptr != 0);
common->currententry->entry_label = LABEL();
set_jumps(common->currententry->entry_calls, common->currententry->entry_label);

sljit_emit_fast_enter(compiler, TMP2, 0);
count_match(common);

local_size = (alt_max > 1) ? 2 : 1;

/* (Reversed) stack layout:
   [private data][return address][optional: str ptr] ... [optional: alternative index][recursive_head_ptr] */

allocate_stack(common, private_data_size + local_size);
/* Save return address. */
OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(local_size - 1), TMP2, 0);

copy_recurse_data(common, ccbegin, ccend, recurse_copy_from_global, local_size, private_data_size + local_size, has_quit);

/* This variable is saved and restored all time when we enter or exit from a recursive context. */
OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->recursive_head_ptr, STACK_TOP, 0);

if (needs_control_head)
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr, SLJIT_IMM, 0);

if (alt_max > 1)
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);

memset(&altbacktrack, 0, sizeof(backtrack_common));
common->quit_label = NULL;
common->accept_label = NULL;
common->quit = NULL;
common->accept = NULL;
altbacktrack.cc = ccbegin;
cc += GET(cc, 1);
while (1)
  {
  altbacktrack.top = NULL;
  altbacktrack.topbacktracks = NULL;

  if (altbacktrack.cc != ccbegin)
    OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_MEM1(STACK_TOP), STACK(0));

  compile_matchingpath(common, altbacktrack.cc, cc, &altbacktrack);
  if (SLJIT_UNLIKELY(sljit_get_compiler_error(compiler)))
    return;

  allocate_stack(common, (alt_max > 1 || has_accept) ? 2 : 1);
  OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), common->recursive_head_ptr);

  if (alt_max > 1 || has_accept)
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, alt_count);

  add_jump(compiler, &match, JUMP(SLJIT_JUMP));

  if (alt_count == 0)
    {
    /* Backtracking path entry. */
    SLJIT_ASSERT(common->currententry->backtrack_label == NULL);
    common->currententry->backtrack_label = LABEL();
    set_jumps(common->currententry->backtrack_calls, common->currententry->backtrack_label);

    sljit_emit_fast_enter(compiler, TMP1, 0);

    if (has_accept)
      accept_exit = CMP(SLJIT_EQUAL, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, alt_max * sizeof (sljit_sw));

    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
    /* Save return address. */
    OP1(SLJIT_MOV, SLJIT_MEM1(TMP2), STACK(local_size - 1), TMP1, 0);

    copy_recurse_data(common, ccbegin, ccend, recurse_swap_global, local_size, private_data_size + local_size, has_quit);

    if (alt_max > 1)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(1));
      free_stack(common, 2);

      if (alt_max > 4)
        {
          /* Table jump if alt_max is greater than 4. */
          next_update_addr = allocate_read_only_data(common, alt_max * sizeof(sljit_uw));
          if (SLJIT_UNLIKELY(next_update_addr == NULL))
            return;
          sljit_emit_ijump(compiler, SLJIT_JUMP, SLJIT_MEM1(TMP1), (sljit_sw)next_update_addr);
          add_label_addr(common, next_update_addr++);
        }
      else
        {
        if (alt_max == 4)
          alt2 = CMP(SLJIT_GREATER_EQUAL, TMP1, 0, SLJIT_IMM, 2 * sizeof(sljit_uw));
        alt1 = CMP(SLJIT_GREATER_EQUAL, TMP1, 0, SLJIT_IMM, sizeof(sljit_uw));
        }
      }
    else
      free_stack(common, has_accept ? 2 : 1);
    }
  else if (alt_max > 4)
    add_label_addr(common, next_update_addr++);
  else
    {
    if (alt_count != 2 * sizeof(sljit_uw))
      {
      JUMPHERE(alt1);
      if (alt_max == 3 && alt_count == sizeof(sljit_uw))
        alt2 = CMP(SLJIT_GREATER_EQUAL, TMP1, 0, SLJIT_IMM, 2 * sizeof(sljit_uw));
      }
    else
      {
      JUMPHERE(alt2);
      if (alt_max == 4)
        alt1 = CMP(SLJIT_GREATER_EQUAL, TMP1, 0, SLJIT_IMM, 3 * sizeof(sljit_uw));
      }
    }

  alt_count += sizeof(sljit_uw);

  compile_backtrackingpath(common, altbacktrack.top);
  if (SLJIT_UNLIKELY(sljit_get_compiler_error(compiler)))
    return;
  set_jumps(altbacktrack.topbacktracks, LABEL());

  if (*cc != OP_ALT)
    break;

  altbacktrack.cc = cc + 1 + LINK_SIZE;
  cc += GET(cc, 1);
  }

/* No alternative is matched. */

quit = LABEL();

copy_recurse_data(common, ccbegin, ccend, recurse_copy_private_to_global, local_size, private_data_size + local_size, has_quit);

OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), STACK(local_size - 1));
free_stack(common, private_data_size + local_size);
OP1(SLJIT_MOV, TMP1, 0, SLJIT_IMM, 0);
sljit_emit_fast_return(compiler, TMP2, 0);

if (common->quit != NULL)
  {
  SLJIT_ASSERT(has_quit);

  set_jumps(common->quit, LABEL());
  OP1(SLJIT_MOV, STACK_TOP, 0, SLJIT_MEM1(SLJIT_SP), common->recursive_head_ptr);
  copy_recurse_data(common, ccbegin, ccend, recurse_copy_shared_to_global, local_size, private_data_size + local_size, has_quit);
  JUMPTO(SLJIT_JUMP, quit);
  }

if (has_accept)
  {
  JUMPHERE(accept_exit);
  free_stack(common, 2);

  /* Save return address. */
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(local_size - 1), TMP1, 0);

  copy_recurse_data(common, ccbegin, ccend, recurse_copy_kept_shared_to_global, local_size, private_data_size + local_size, has_quit);

  OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), STACK(local_size - 1));
  free_stack(common, private_data_size + local_size);
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_IMM, 0);
  sljit_emit_fast_return(compiler, TMP2, 0);
  }

if (common->accept != NULL)
  {
  SLJIT_ASSERT(has_accept);

  set_jumps(common->accept, LABEL());

  OP1(SLJIT_MOV, STACK_TOP, 0, SLJIT_MEM1(SLJIT_SP), common->recursive_head_ptr);
  OP1(SLJIT_MOV, TMP2, 0, STACK_TOP, 0);

  allocate_stack(common, 2);
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, alt_count);
  }

set_jumps(match, LABEL());

OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), TMP2, 0);

copy_recurse_data(common, ccbegin, ccend, recurse_swap_global, local_size, private_data_size + local_size, has_quit);

OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(TMP2), STACK(local_size - 1));
OP1(SLJIT_MOV, TMP1, 0, SLJIT_IMM, 1);
sljit_emit_fast_return(compiler, TMP2, 0);
}